

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,ConditionalStatement *stmt)

{
  bool bVar1;
  reference pCVar2;
  long in_RSI;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_RDI;
  type_conflict1 trueState;
  Condition *cond;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *__range3;
  int falseState;
  Pattern *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  Expression *in_stack_ffffffffffffffa0;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_stack_ffffffffffffffa8;
  __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
  local_28;
  long local_20;
  int local_14;
  long local_10;
  
  local_10 = in_RSI;
  local_14 = TestAnalysis::unreachableState((TestAnalysis *)in_RDI);
  local_20 = local_10 + 0x20;
  local_28._M_current =
       (Condition *)
       std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *
                  )in_stack_ffffffffffffff88);
  std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>::end
            ((span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                        *)in_RDI,
                       (__normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
             ::operator*(&local_28);
    not_null<const_slang::ast::Expression_*>::operator*
              ((not_null<const_slang::ast::Expression_*> *)0x24c880);
    visitCondition(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x24c89c);
    if (pCVar2->pattern != (Pattern *)0x0) {
      visit<slang::ast::Pattern>(in_RDI,in_stack_ffffffffffffff88);
    }
    TestAnalysis::joinState((TestAnalysis *)in_RDI,&local_14,&in_RDI->stateWhenFalse);
    setState(in_RDI,in_RDI->stateWhenTrue);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::ConditionalStatement::Condition_*,_std::span<const_slang::ast::ConditionalStatement::Condition,_18446744073709551615UL>_>
    ::operator++(&local_28);
  }
  visit<slang::ast::Statement>(in_RDI,(Statement *)in_stack_ffffffffffffff88);
  setState(in_RDI,local_14);
  if (*(long *)(local_10 + 0x38) != 0) {
    visit<slang::ast::Statement>(in_RDI,(Statement *)in_stack_ffffffffffffff88);
  }
  TestAnalysis::joinState((TestAnalysis *)in_RDI,&in_RDI->state,(int *)&stack0xffffffffffffff9c);
  return;
}

Assistant:

void visitStmt(const ConditionalStatement& stmt) {
        auto falseState = (DERIVED).unreachableState();
        for (auto& cond : stmt.conditions) {
            visitCondition(*cond.expr);

            if (cond.pattern)
                visit(*cond.pattern);

            (DERIVED).joinState(falseState, stateWhenFalse);
            setState(std::move(stateWhenTrue));
        }

        visit(stmt.ifTrue);

        auto trueState = std::move(state);
        setState(std::move(falseState));
        if (stmt.ifFalse)
            visit(*stmt.ifFalse);

        (DERIVED).joinState(state, trueState);
    }